

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCex.c
# Opt level: O2

int Gia_ManVerifyCex(Gia_Man_t *pAig,Abc_Cex_t *p,int fDualOut)

{
  undefined8 uVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int v;
  ulong uVar9;
  
  Gia_ManCleanMark0(pAig);
  uVar9 = 0;
  while( true ) {
    iVar2 = (int)uVar9;
    if (pAig->nRegs <= iVar2) break;
    pGVar3 = Gia_ManCi(pAig,(pAig->vCis->nSize - pAig->nRegs) + iVar2);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    *(ulong *)pGVar3 =
         *(ulong *)pGVar3 & 0xffffffffbfffffff |
         (ulong)(((uint)(&p[1].iPo)[uVar9 >> 5] >> ((byte)uVar9 & 0x1f) & 1) << 0x1e);
    uVar9 = (ulong)(iVar2 + 1);
  }
  iVar2 = 0;
  do {
    iVar7 = (int)uVar9;
    if (p->iFrame < iVar2) {
LAB_005b3776:
      if (iVar7 == p->nBits) {
        if (fDualOut == 0) {
          pGVar3 = Gia_ManPo(pAig,p->iPo);
          uVar8 = (uint)*(undefined8 *)pGVar3;
        }
        else {
          pGVar3 = Gia_ManPo(pAig,p->iPo * 2);
          uVar1 = *(undefined8 *)pGVar3;
          pGVar3 = Gia_ManPo(pAig,p->iPo * 2 + 1);
          uVar8 = (uint)uVar1 ^ (uint)*(undefined8 *)pGVar3;
        }
        Gia_ManCleanMark0(pAig);
        return uVar8 >> 0x1e & 1;
      }
      __assert_fail("iBit == p->nBits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCex.c"
                    ,0x47,"int Gia_ManVerifyCex(Gia_Man_t *, Abc_Cex_t *, int)");
    }
    for (v = 0; uVar8 = iVar7 + v, v < pAig->vCis->nSize - pAig->nRegs; v = v + 1) {
      pGVar3 = Gia_ManCi(pAig,v);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      *(ulong *)pGVar3 =
           *(ulong *)pGVar3 & 0xffffffffbfffffff |
           (ulong)(((uint)(&p[1].iPo)[(int)uVar8 >> 5] >> ((byte)uVar8 & 0x1f) & 1) << 0x1e);
    }
    for (iVar6 = 0; iVar6 < pAig->nObjs; iVar6 = iVar6 + 1) {
      pGVar3 = Gia_ManObj(pAig,iVar6);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar9 = *(ulong *)pGVar3;
      if ((uVar9 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar9) {
        uVar5 = (uint)(uVar9 >> 0x20);
        *(ulong *)pGVar3 =
             uVar9 & 0xffffffff3fffffff |
             (ulong)(((uVar5 >> 0x1d ^ *(uint *)(pGVar3 + -(ulong)(uVar5 & 0x1fffffff)) >> 0x1e) &
                      ((uint)(uVar9 >> 0x1d) & 7 ^ *(uint *)(pGVar3 + -(uVar9 & 0x1fffffff)) >> 0x1e
                      ) & 1) << 0x1e);
      }
    }
    for (iVar6 = 0; iVar6 < pAig->vCos->nSize; iVar6 = iVar6 + 1) {
      pGVar3 = Gia_ManCo(pAig,iVar6);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar5 = (uint)*(ulong *)pGVar3;
      *(ulong *)pGVar3 =
           *(ulong *)pGVar3 & 0xffffffffbfffffff |
           (ulong)((uVar5 * 2 ^ *(uint *)(pGVar3 + -(ulong)(uVar5 & 0x1fffffff))) & 0x40000000);
    }
    if (iVar2 == p->iFrame) {
      iVar7 = iVar7 + v;
      goto LAB_005b3776;
    }
    for (iVar7 = 0; iVar7 < pAig->nRegs; iVar7 = iVar7 + 1) {
      pGVar3 = Gia_ManCo(pAig,(pAig->vCos->nSize - pAig->nRegs) + iVar7);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar4 = Gia_ManCi(pAig,(pAig->vCis->nSize - pAig->nRegs) + iVar7);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      *(ulong *)pGVar4 =
           *(ulong *)pGVar4 & 0xffffffffbfffffff | (ulong)((uint)*(undefined8 *)pGVar3 & 0x40000000)
      ;
    }
    iVar2 = iVar2 + 1;
    uVar9 = (ulong)uVar8;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Resimulates the counter-example.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Gia_ManVerifyCex( Gia_Man_t * pAig, Abc_Cex_t * p, int fDualOut )
{
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int RetValue, i, k, iBit = 0;
    Gia_ManCleanMark0(pAig);
    Gia_ManForEachRo( pAig, pObj, i )
        pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
    for ( i = 0; i <= p->iFrame; i++ )
    {
        Gia_ManForEachPi( pAig, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
        Gia_ManForEachAnd( pAig, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( pAig, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        if ( i == p->iFrame )
            break;
        Gia_ManForEachRiRo( pAig, pObjRi, pObjRo, k )
        {
            pObjRo->fMark0 = pObjRi->fMark0;
        }
    }
    assert( iBit == p->nBits );
    if ( fDualOut )
        RetValue = Gia_ManPo(pAig, 2*p->iPo)->fMark0 ^ Gia_ManPo(pAig, 2*p->iPo+1)->fMark0;
    else
        RetValue = Gia_ManPo(pAig, p->iPo)->fMark0;
    Gia_ManCleanMark0(pAig);
    return RetValue;
}